

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpfile.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_12::CorruptionReporter::Corruption
          (CorruptionReporter *this,size_t bytes,Status *status)

{
  WritableFile *pWVar1;
  Slice local_90;
  Status local_80;
  Status local_78 [6];
  allocator local_41;
  string local_40 [8];
  string r;
  Status *status_local;
  size_t bytes_local;
  CorruptionReporter *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"corruption: ",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  AppendNumberTo((string *)local_40,bytes);
  std::__cxx11::string::operator+=(local_40," bytes; ");
  Status::ToString_abi_cxx11_(local_78);
  std::__cxx11::string::operator+=(local_40,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::push_back((char)local_40);
  pWVar1 = this->dst_;
  Slice::Slice(&local_90,(string *)local_40);
  (*pWVar1->_vptr_WritableFile[2])(&local_80,pWVar1,&local_90);
  Status::~Status(&local_80);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Corruption(size_t bytes, const Status& status) override {
    std::string r = "corruption: ";
    AppendNumberTo(&r, bytes);
    r += " bytes; ";
    r += status.ToString();
    r.push_back('\n');
    dst_->Append(r);
  }